

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

void mat_inf_norm_cols_sym_triu(csc *M,c_float *E)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  lVar3 = 0;
  lVar2 = M->n;
  if (M->n < 1) {
    lVar2 = lVar3;
  }
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    E[lVar3] = 0.0;
  }
  lVar3 = 0;
  while (lVar4 = lVar3, lVar4 != lVar2) {
    lVar1 = M->p[lVar4 + 1];
    for (lVar5 = M->p[lVar4]; lVar3 = lVar4 + 1, lVar5 < lVar1; lVar5 = lVar5 + 1) {
      lVar3 = M->i[lVar5];
      dVar7 = M->x[lVar5];
      dVar6 = -dVar7;
      if (-dVar7 <= dVar7) {
        dVar6 = dVar7;
      }
      dVar7 = dVar6;
      if (dVar6 <= E[lVar4]) {
        dVar7 = E[lVar4];
      }
      E[lVar4] = dVar7;
      if (lVar3 != lVar4) {
        if (dVar6 <= E[lVar3]) {
          dVar6 = E[lVar3];
        }
        E[lVar3] = dVar6;
      }
    }
  }
  return;
}

Assistant:

void mat_inf_norm_cols_sym_triu(const csc *M, c_float *E) {
  c_int   i, j, ptr;
  c_float abs_x;

  // Initialize zero max elements
  for (j = 0; j < M->n; j++) {
    E[j] = 0.;
  }

  // Compute maximum across columns
  // Note that element (i, j) contributes to
  // -> Column j (as expected in any matrices)
  // -> Column i (which is equal to row i for symmetric matrices)
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      i     = M->i[ptr];
      abs_x = c_absval(M->x[ptr]);
      E[j]  = c_max(abs_x, E[j]);

      if (i != j) {
        E[i] = c_max(abs_x, E[i]);
      }
    }
  }
}